

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall fmt::v7::detail::bigint::~bigint(bigint *this)

{
  ulong uVar1;
  uint *puVar2;
  
  uVar1 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (0x20 < uVar1) {
    __assert_fail("bigits_.capacity() <= bigits_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                  ,0x51e,"fmt::detail::bigint::~bigint()");
  }
  puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  if (puVar2 != (this->bigits_).store_) {
    operator_delete(puVar2,uVar1 << 2);
    return;
  }
  return;
}

Assistant:

size_t capacity() const FMT_NOEXCEPT { return capacity_; }